

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_async_future.cpp
# Opt level: O3

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  _Any_data *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  async_future<int> f0_2;
  int result;
  unique_lock<std::mutex> lock;
  executor_future_or_t<has_execute_member,_typename_std::result_of<typename_std::decay<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_async_future_cpp:58:29)>::type_(async_future<int>)>::type,_async_future_clang_workaround>
  f1;
  async_future<int> f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  promise<bool> local_b0;
  uint local_9c;
  unique_lock<std::mutex> local_98;
  promise<bool> local_88;
  undefined1 local_78 [32];
  _Any_data local_58;
  code *local_48;
  code *local_40;
  promise<void> local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_58._0_4_ = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            ((async_future<int> *)local_78,(int *)local_58._M_pod_data);
  if ((asynchronous_state<int> *)CONCAT44(local_78._4_4_,local_78._0_4_) ==
      (asynchronous_state<int> *)0x0) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x24,"int main()");
  }
  bVar6 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                    ((asynchronous_state<int> *)CONCAT44(local_78._4_4_,local_78._0_4_));
  if (!bVar6) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x25,"int main()");
  }
  iVar7 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)local_78);
  if (iVar7 != 0xd) {
    __assert_fail("13 == f0.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x27,"int main()");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
  if ((asynchronous_state<void> *)CONCAT44(local_78._4_4_,local_78._0_4_) ==
      (asynchronous_state<void> *)0x0) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x2e,"int main()");
  }
  bVar6 = std::experimental::v1::detail::asynchronous_state<void>::is_ready
                    ((asynchronous_state<void> *)CONCAT44(local_78._4_4_,local_78._0_4_));
  if (!bVar6) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x2f,"int main()");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  local_78._0_4_ = 0xd;
  std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
            ((async_future<int> *)&local_b0,(int *)local_78);
  if (local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("f0.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x36,"int main()");
  }
  bVar6 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                    ((asynchronous_state<int> *)
                     local_b0.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (!bVar6) {
    __assert_fail("f0.is_ready()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                  ,0x37,"int main()");
  }
  if (local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    pcVar8 = 
    "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = int, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:58:29)]"
    ;
LAB_00102fed:
    __assert_fail("predecessor_future.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future"
                  ,0x32e,pcVar8);
  }
  std::
  __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<int>>>
            ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_c8,
             (allocator<std::experimental::v1::detail::asynchronous_state<int>_> *)local_78);
  std::experimental::v1::promise<int>::get_async_future((promise<int> *)&local_88);
  p_Var2 = p_Stack_c0;
  p_Var1 = local_c8;
  local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00102d45:
    pcVar8 = "std::experimental::promise<int>::promise(promise<T> &&) [T = int]";
  }
  else {
    local_78._8_8_ = p_Var1;
    local_78._16_8_ = p_Var2;
    local_98._M_device =
         &(local_b0.ptr_to_state_.
           super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->mutex_;
    local_98._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_98);
    local_98._M_owns = true;
    if (((local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->maybe_result_).has_value_ == true) {
      std::unique_lock<std::mutex>::unlock(&local_98);
      std::experimental::v1::detail::asynchronous_state<int>::to_async_future
                ((asynchronous_state<int> *)&local_58);
      std::experimental::v1::detail::
      copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
      ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                ((anon_class_32_2_fc850240_for_move_only_function_ *)local_78,
                 (async_future<int> *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      uVar5 = local_78._16_8_;
      (local_b0.ptr_to_state_.
       super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->continuation_complete_ = true;
      std::unique_lock<std::mutex>::~unique_lock(&local_98);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
      }
    }
    else {
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._M_unused._M_object = operator_new(0x20);
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
           p_Var1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) =
           p_Var2;
      local_40 = std::
                 _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                 ::_M_manager;
      std::function<void_(std::experimental::v1::detail::async_future<int>)>::operator=
                ((function<void_(std::experimental::v1::detail::async_future<int>)> *)
                 &(local_b0.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->continuation_,
                 (function<void_(std::experimental::v1::detail::async_future<int>)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_98);
    }
    _Var4._M_pi = local_b0.ptr_to_state_.
                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_b0.ptr_to_state_.
    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_b0.ptr_to_state_.
    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
    }
    iVar7 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)&local_88);
    if (iVar7 != 0x14) {
      __assert_fail("result == 20",
                    "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                    ,0x41,"int main()");
    }
    if (local_88.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.ptr_to_state_.
                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b0.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.ptr_to_state_.
                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_78._0_4_ = 0xd;
    std::experimental::v1::detail::async_future<int>::make_ready<int,_nullptr>
              ((async_future<int> *)&local_b0,(int *)local_78);
    if (local_b0.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      __assert_fail("f0.valid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                    ,0x48,"int main()");
    }
    bVar6 = std::experimental::v1::detail::asynchronous_state<int>::is_ready
                      ((asynchronous_state<int> *)
                       local_b0.ptr_to_state_.
                       super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (!bVar6) {
      __assert_fail("f0.is_ready()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                    ,0x49,"int main()");
    }
    local_9c = 0;
    if (local_b0.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      pcVar8 = 
      "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = int, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:77:29)]"
      ;
      goto LAB_00102fed;
    }
    std::
    __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<void>>>
              ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
                *)&local_c8,
               (allocator<std::experimental::v1::detail::asynchronous_state<void>_> *)local_78);
    std::experimental::v1::promise<void>::get_async_future((promise<void> *)&local_88);
    peVar3 = local_b0.ptr_to_state_.
             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var2 = p_Stack_c0;
    p_Var1 = local_c8;
    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_78._8_8_ = p_Var1;
      local_78._16_8_ = p_Var2;
      local_98._M_device =
           &(local_b0.ptr_to_state_.
             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->mutex_;
      local_98._M_owns = false;
      local_78._24_8_ = &local_9c;
      std::unique_lock<std::mutex>::lock(&local_98);
      local_98._M_owns = true;
      if ((peVar3->maybe_result_).has_value_ == true) {
        std::unique_lock<std::mutex>::unlock(&local_98);
        std::experimental::v1::detail::asynchronous_state<int>::to_async_future
                  ((asynchronous_state<int> *)&local_58);
        p_Var9 = &local_58;
        std::experimental::v1::detail::
        copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
        ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                  ((anon_class_32_2_fc850240_for_move_only_function_ *)local_78,
                   (async_future<int> *)p_Var9);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        uVar5 = local_78._16_8_;
        peVar3->continuation_complete_ = true;
        std::unique_lock<std::mutex>::~unique_lock(&local_98);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
        }
      }
      else {
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58._M_unused._M_object = operator_new(0x20);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
             p_Var1;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) =
             p_Var2;
        *(uint **)((long)local_58._M_unused._0_8_ + 0x18) = &local_9c;
        p_Var9 = &local_58;
        local_40 = std::
                   _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(std::experimental::v1::detail::async_future<int>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                   ::_M_manager;
        std::function<void_(std::experimental::v1::detail::async_future<int>)>::operator=
                  ((function<void_(std::experimental::v1::detail::async_future<int>)> *)
                   &peVar3->continuation_,
                   (function<void_(std::experimental::v1::detail::async_future<int>)> *)p_Var9);
        if (local_48 != (code *)0x0) {
          p_Var9 = &local_58;
          (*local_48)(p_Var9,p_Var9,3);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_98);
      }
      _Var4._M_pi = local_b0.ptr_to_state_.
                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
      }
      std::experimental::v1::detail::asynchronous_state<void>::wait
                ((asynchronous_state<void> *)
                 local_88.ptr_to_state_.
                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,p_Var9);
      if (local_9c != 0x14) {
        __assert_fail("result == 20",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x54,"int main()");
      }
      if (local_88.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        __assert_fail("f0.valid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x5b,"int main()");
      }
      bVar6 = std::experimental::v1::detail::asynchronous_state<void>::is_ready
                        ((asynchronous_state<void> *)
                         local_b0.ptr_to_state_.
                         super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar6) {
        __assert_fail("f0.is_ready()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x5c,"int main()");
      }
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        pcVar8 = 
        "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = void, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:95:29)]"
        ;
        goto LAB_00102fed;
      }
      std::
      __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<int>>>
                ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>
                  *)&local_c8,
                 (allocator<std::experimental::v1::detail::asynchronous_state<int>_> *)local_78);
      std::experimental::v1::promise<int>::get_async_future((promise<int> *)&local_88);
      peVar3 = local_b0.ptr_to_state_.
               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var2 = p_Stack_c0;
      p_Var1 = local_c8;
      local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00102d45;
      local_78._8_8_ = p_Var1;
      local_78._16_8_ = p_Var2;
      local_98._M_device =
           &(local_b0.ptr_to_state_.
             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->mutex_;
      local_98._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_98);
      local_98._M_owns = true;
      if ((peVar3->maybe_result_).has_value_ == true) {
        std::unique_lock<std::mutex>::unlock(&local_98);
        std::experimental::v1::detail::asynchronous_state<void>::to_async_future
                  ((asynchronous_state<void> *)&local_58);
        std::experimental::v1::detail::
        copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
        ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                  ((anon_class_32_2_fc850240_for_move_only_function_ *)local_78,
                   (async_future<void> *)&local_58);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        uVar5 = local_78._16_8_;
        peVar3->continuation_complete_ = true;
        std::unique_lock<std::mutex>::~unique_lock(&local_98);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
        }
      }
      else {
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58._M_unused._M_object = operator_new(0x20);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
             p_Var1;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) =
             p_Var2;
        local_40 = std::
                   _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                   ::_M_manager;
        std::function<void_(std::experimental::v1::detail::async_future<void>)>::operator=
                  ((function<void_(std::experimental::v1::detail::async_future<void>)> *)
                   &peVar3->continuation_,
                   (function<void_(std::experimental::v1::detail::async_future<void>)> *)&local_58);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,3);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_98);
      }
      _Var4._M_pi = local_b0.ptr_to_state_.
                    super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_b0.ptr_to_state_.
      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
      }
      iVar7 = std::experimental::v1::detail::async_future<int>::get((async_future<int> *)&local_88);
      if (iVar7 != 0x14) {
        __assert_fail("result == 20",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x66,"int main()");
      }
      if (local_88.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::experimental::v1::detail::async_future<void>::make_ready<void,_nullptr>();
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        __assert_fail("f0.valid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x6d,"int main()");
      }
      bVar6 = std::experimental::v1::detail::asynchronous_state<void>::is_ready
                        ((asynchronous_state<void> *)
                         local_b0.ptr_to_state_.
                         super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (!bVar6) {
        __assert_fail("f0.is_ready()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                      ,0x6e,"int main()");
      }
      local_9c = 0;
      if (local_b0.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        pcVar8 = 
        "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = void, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:114:29)]"
        ;
        goto LAB_00102fed;
      }
      std::
      __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<void>>>
                ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
                  *)&local_c8,
                 (allocator<std::experimental::v1::detail::asynchronous_state<void>_> *)local_78);
      std::experimental::v1::promise<void>::get_async_future((promise<void> *)&local_88);
      peVar3 = local_b0.ptr_to_state_.
               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var2 = p_Stack_c0;
      p_Var1 = local_c8;
      local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_78._8_8_ = p_Var1;
        local_78._16_8_ = p_Var2;
        local_98._M_device =
             &(local_b0.ptr_to_state_.
               super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->mutex_;
        local_98._M_owns = false;
        local_78._24_8_ = &local_9c;
        std::unique_lock<std::mutex>::lock(&local_98);
        local_98._M_owns = true;
        if ((peVar3->maybe_result_).has_value_ == true) {
          std::unique_lock<std::mutex>::unlock(&local_98);
          std::experimental::v1::detail::asynchronous_state<void>::to_async_future
                    ((asynchronous_state<void> *)&local_58);
          p_Var9 = &local_58;
          std::experimental::v1::detail::
          copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
          ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                    ((anon_class_32_2_fc850240_for_move_only_function_ *)local_78,
                     (async_future<void> *)p_Var9);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          uVar5 = local_78._16_8_;
          peVar3->continuation_complete_ = true;
          std::unique_lock<std::mutex>::~unique_lock(&local_98);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
          }
        }
        else {
          local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_58._M_unused._M_object = operator_new(0x20);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
               p_Var1;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10)
               = p_Var2;
          *(uint **)((long)local_58._M_unused._0_8_ + 0x18) = &local_9c;
          p_Var9 = &local_58;
          local_40 = std::
                     _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                     ::_M_invoke;
          local_48 = std::
                     _Function_handler<void_(std::experimental::v1::detail::async_future<void>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                     ::_M_manager;
          std::function<void_(std::experimental::v1::detail::async_future<void>)>::operator=
                    ((function<void_(std::experimental::v1::detail::async_future<void>)> *)
                     &peVar3->continuation_,
                     (function<void_(std::experimental::v1::detail::async_future<void>)> *)p_Var9);
          if (local_48 != (code *)0x0) {
            p_Var9 = &local_58;
            (*local_48)(p_Var9,p_Var9,3);
          }
          std::unique_lock<std::mutex>::~unique_lock(&local_98);
        }
        _Var4._M_pi = local_b0.ptr_to_state_.
                      super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_b0.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_b0.ptr_to_state_.
        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
        }
        if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
        }
        std::experimental::v1::detail::asynchronous_state<void>::wait
                  ((asynchronous_state<void> *)
                   local_88.ptr_to_state_.
                   super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,p_Var9);
        if (local_9c != 0x14) {
          __assert_fail("result == 20",
                        "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                        ,0x7a,"int main()");
        }
        if (local_88.ptr_to_state_.
            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_b0.ptr_to_state_.
            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.ptr_to_state_.
                     super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::
        __shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<bool>>>
                  ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,(__gnu_cxx::_Lock_policy)2>
                    *)&local_b0,
                   (allocator<std::experimental::v1::detail::asynchronous_state<bool>_> *)local_78);
        std::experimental::v1::promise<bool>::get_async_future(&local_88);
        local_9c = local_9c & 0xffffff00;
        if (local_88.ptr_to_state_.
            super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          pcVar8 = 
          "async_future<typename std::result_of<typename std::decay<F>::type (async_future<T>)>::type> std::experimental::v1::detail::one_way_executor_then(async_future<T> &, const OneWayExecutor &, F &&) [T = bool, OneWayExecutor = has_execute_member, F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp:133:9)]"
          ;
          goto LAB_00102fed;
        }
        std::
        __shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<void>>>
                  ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<void>,(__gnu_cxx::_Lock_policy)2>
                    *)&local_c8,
                   (allocator<std::experimental::v1::detail::asynchronous_state<void>_> *)local_78);
        std::experimental::v1::promise<void>::get_async_future(local_38);
        p_Var2 = p_Stack_c0;
        p_Var1 = local_c8;
        local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_78._8_8_ = p_Var1;
          local_78._16_8_ = p_Var2;
          local_98._M_device =
               &(local_88.ptr_to_state_.
                 super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->mutex_;
          local_98._M_owns = false;
          local_78._24_8_ = &local_9c;
          std::unique_lock<std::mutex>::lock(&local_98);
          local_98._M_owns = true;
          if (((local_88.ptr_to_state_.
                super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->maybe_result_).has_value_ == true) {
            std::unique_lock<std::mutex>::unlock(&local_98);
            std::experimental::v1::detail::asynchronous_state<bool>::to_async_future
                      ((asynchronous_state<bool> *)&local_58);
            std::experimental::v1::detail::
            copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>
            ::anon_class_32_2_fc850240_for_move_only_function_::operator()
                      ((anon_class_32_2_fc850240_for_move_only_function_ *)local_78,
                       (async_future<bool> *)&local_58);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            }
            uVar5 = local_78._16_8_;
            (local_88.ptr_to_state_.
             super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->continuation_complete_ = true;
            std::unique_lock<std::mutex>::~unique_lock(&local_98);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
            }
          }
          else {
            local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_58._M_unused._M_object = operator_new(0x20);
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
                 p_Var1;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)local_58._M_unused._0_8_ + 0x10) = p_Var2;
            *(uint **)((long)local_58._M_unused._0_8_ + 0x18) = &local_9c;
            local_40 = std::
                       _Function_handler<void_(std::experimental::v1::detail::async_future<bool>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                       ::_M_invoke;
            local_48 = std::
                       _Function_handler<void_(std::experimental::v1::detail::async_future<bool>),_std::experimental::v1::detail::copyable_function<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future:153:27)>_>
                       ::_M_manager;
            std::function<void_(std::experimental::v1::detail::async_future<bool>)>::operator=
                      (&((local_88.ptr_to_state_.
                          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->continuation_).
                        super_function<void_(std::experimental::v1::detail::async_future<bool>)>,
                       (function<void_(std::experimental::v1::detail::async_future<bool>)> *)
                       &local_58);
            if (local_48 != (code *)0x0) {
              (*local_48)(&local_58,&local_58,3);
            }
            std::unique_lock<std::mutex>::~unique_lock(&local_98);
          }
          _Var4._M_pi = local_88.ptr_to_state_.
                        super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_88.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_88.ptr_to_state_.
          super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
          }
          if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
          }
          if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
          }
          if ((char)local_9c != '\x01') {
            local_78._0_4_ = local_78._0_4_ & 0xffffff00;
            std::experimental::v1::promise<bool>::set_value_impl<bool,_nullptr>
                      (&local_b0,(bool *)local_78);
            if ((char)local_9c != '\0') {
              if (local_88.ptr_to_state_.
                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_88.ptr_to_state_.
                           super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if (local_b0.ptr_to_state_.
                  super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b0.ptr_to_state_.
                           super___shared_ptr<std::experimental::v1::detail::asynchronous_state<bool>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
              std::ostream::put(-0x30);
              std::ostream::flush();
              return 0;
            }
            __assert_fail("continuation_has_run",
                          "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                          ,0x8f,"int main()");
          }
          __assert_fail("!continuation_has_run",
                        "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_async_future.cpp"
                        ,0x8d,"int main()");
        }
      }
    }
    pcVar8 = "std::experimental::promise<void>::promise(promise<T> &&) [T = void]";
  }
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __assert_fail("valid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/./experimental/future"
                ,0x254,pcVar8);
}

Assistant:

int main()
{
  using namespace std::experimental::v1::detail;

  {
    // non-void make_ready()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    assert(13 == f0.get());
  }

  {
    // void make_ready()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());
  }

  {
    // non-void -> non-void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<int> predecessor)
    {
      return predecessor.get() + 7;
    });

    int result = f1.get();

    assert(result == 20);
  }

  {
    // non-void -> void then()

    async_future<int> f0 = async_future<int>::make_ready(13);
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<int> predecessor)
    {
      result = predecessor.get() + 7;
    });

    f1.wait();

    assert(result == 20);
  }

  {
    // void -> non-void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    auto f1 = f0.then(exec, [](async_future<void> predecessor)
    {
      predecessor.wait();
      return 20;
    });

    int result = f1.get();
    assert(result == 20);
  }

  {
    // void -> void then()

    async_future<void> f0 = async_future<void>::make_ready();
    assert(f0.valid());
    assert(f0.is_ready());

    has_execute_member exec;
    int result = 0;
    auto f1 = f0.then(exec, [&](async_future<void> predecessor)
    {
      predecessor.wait();
      result = 20;
    });

    f1.wait();

    assert(result == 20);
  }
  {
    // async_future from promise

    std::experimental::promise<bool> p;
    async_future<bool> f = p.get_async_future();
    bool continuation_has_run = false;

    has_execute_member exec;
    f.then(exec,
        [&continuation_has_run]( async_future<bool> predecessor)
        {

            assert(false == predecessor.get());
            continuation_has_run = true;

        });

    assert(!continuation_has_run);
    p.set_value(false);
    assert(continuation_has_run);
  }
  std::cout << "OK" << std::endl;
}